

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_cobs.c
# Opt level: O2

ssize_t mpt_encode_cobs(mpt_encode_state *info,iovec *cobs,iovec *base)

{
  size_t sVar1;
  char *pcVar2;
  uint uVar3;
  char *pcVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  char cVar8;
  byte bVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  size_t sVar14;
  iovec tmp;
  
  if (cobs == (iovec *)0x0) {
    info->_ctx = 0;
    info->done = 0;
  }
  else {
    tmp.iov_len = info->done;
    uVar10 = info->scratch;
    uVar11 = cobs->iov_len;
    cVar8 = (char)uVar10;
    if (cobs->iov_base == (void *)0x0) {
      return (ulong)-(uint)(((uVar10 & 0xff) != 0 || tmp.iov_len != 0) || uVar11 != 0) |
             0xffffffffffffffef;
    }
    uVar5 = uVar11 - tmp.iov_len;
    if (uVar11 < tmp.iov_len) {
      return -1;
    }
    uVar11 = uVar10 & 0xff;
    if (uVar5 < uVar11) {
      return -1;
    }
    pcVar4 = (char *)((long)cobs->iov_base + tmp.iov_len);
    if (base != (iovec *)0x0) {
      sVar1 = base->iov_len;
      if (sVar1 == 0) {
        return -2;
      }
      pcVar2 = (char *)base->iov_base;
      if (pcVar2 == (char *)0x0) {
        tmp.iov_base = (void *)0x0;
        lVar6 = sVar1 + (info->_ctx == 0);
        do {
          lVar6 = lVar6 + -1;
          if (lVar6 == 0) {
            info->_ctx = 0;
            info->done = tmp.iov_len;
            info->scratch = 0;
            return tmp.iov_len;
          }
          tmp.iov_len = mpt_memrchr(&tmp,1,0);
        } while (-1 < (long)tmp.iov_len);
        return -2;
      }
      if (cVar8 == '\0') {
        if (1 < uVar5) {
          lVar6 = uVar5 - 1;
          uVar10 = 1;
          goto LAB_0011042a;
        }
      }
      else {
        lVar6 = uVar5 - uVar11;
        if (lVar6 != 0) {
LAB_0011042a:
          pcVar4 = pcVar4 + (uVar10 & 0xff);
          do {
            bVar9 = (byte)uVar10;
            sVar14 = sVar1 - 1;
            if (sVar1 == 0) {
              sVar1 = 0;
              goto LAB_001104bd;
            }
            if (*pcVar2 == '\0') {
              lVar12 = -(uVar10 & 0xff);
              lVar7 = -1;
              lVar13 = 1;
LAB_00110491:
              pcVar4[lVar12] = bVar9;
              pcVar4 = pcVar4 + lVar13;
              lVar7 = lVar6 + lVar7;
              uVar10 = 1;
            }
            else {
              *pcVar4 = *pcVar2;
              lVar7 = lVar6 + -1;
              uVar3 = (int)uVar10 + 1;
              if ((char)uVar3 == -1) {
                if (lVar7 != 0) {
                  bVar9 = 0xff;
                  lVar12 = -0xfe;
                  lVar7 = -2;
                  lVar13 = 2;
                  goto LAB_00110491;
                }
                bVar9 = 0xfe;
                lVar6 = 0;
                goto LAB_001104bd;
              }
              pcVar4 = pcVar4 + 1;
              uVar10 = (ulong)uVar3;
            }
            pcVar2 = pcVar2 + 1;
            lVar6 = lVar7;
            sVar1 = sVar14;
          } while (lVar7 != 0);
          bVar9 = (byte)uVar10;
          lVar6 = 0;
LAB_001104bd:
          pcVar4[-(uVar10 & 0xff)] = (char)uVar10;
          lVar6 = cobs->iov_len - lVar6;
          info->_ctx = info->_ctx + (lVar6 - (info->done + info->scratch));
          info->done = lVar6 - (ulong)bVar9;
          info->scratch = (ulong)bVar9;
          return base->iov_len - sVar1;
        }
      }
      return -0x11;
    }
    if (uVar5 <= uVar11) {
      return -0x11;
    }
    if (cVar8 == '\0') {
      if (uVar5 < 2) {
        return -0x11;
      }
      pcVar4[0] = '\x01';
      pcVar4[1] = '\0';
      sVar1 = 2;
    }
    else {
      *pcVar4 = cVar8;
      pcVar4[uVar11] = '\0';
      sVar1 = ((int)uVar10 + 1U & 0xff) + tmp.iov_len;
    }
    info->_ctx = 0;
    info->done = sVar1;
  }
  info->scratch = 0;
  return 0;
}

Assistant:

extern ssize_t mpt_encode_cobs(MPT_STRUCT(encode_state) *info, const struct iovec *cobs, const struct iovec *base)
#endif
{
	const uint8_t *src;
	uint8_t *dst, code;
	size_t left, len;
	
	if (!cobs) {
		info->_ctx = 0;
		info->done = 0;
		info->scratch = 0;
		return 0;
	}
	code = info->scratch;
	len  = info->done;
	left = cobs->iov_len;
	
	/* uninitialized target */
	if (!(dst = cobs->iov_base)) {
		if (code || len || left) {
			return MPT_ERROR(BadArgument);
		}
		return MPT_ERROR(MissingBuffer);
	}
	/* bad encoder state */
	if ((len > left)
	    || (code > (left -= len))
	    || (code > left)) {
		return MPT_ERROR(BadArgument);
	}
	dst += len;
	
	/* message termination */
	if (!base) {
		/* need enough data to save end */
		if (code >= left) {
			return MPT_ERROR(MissingBuffer);
		}
		/* special case: empty message */
		if (!code) {
			if (left < 2) {
				return MPT_ERROR(MissingBuffer);
			}
			/* '\x00\x00' not allowed in cobs data stream.
			 * Decoder consumes single encoded zero. */
			dst[0] = 1;
			dst[1] = 0;
			len = 2;
		}
		/* cobs message termination */
		else {
			*dst = code;
			dst[code++] = 0;
			len += code;
		}
		info->_ctx = 0;
		info->done = len;
		info->scratch = 0;
		
		return 0;
	}
	src = base->iov_base;
	len = base->iov_len;
	
	/* start priority data */
	if (!len) {
		return MPT_ERROR(BadValue);
	}
	/* message deletion */
	if (!src) {
		struct iovec tmp;
		ssize_t pos = info->done;
		
		/* message in progress */
		if (info->_ctx) {
			--len;
		}
		tmp.iov_base = (void *) src;
		while (len--) {
			tmp.iov_len  = pos;
			if ((pos = mpt_memrchr(&tmp, 1, 0)) < 0) {
				return MPT_ERROR(BadValue);
			}
		}
		info->_ctx = 0;
		info->done = pos;
		info->scratch = 0;
		
		/* save start of encoder state for next message */
		return pos;
	}
	
	/* remaining data in cobs */
	if (code) {
		if (!(left -= code)) return MPT_ERROR(MissingBuffer);
	} else {
		if (left <= (code = 1)) return MPT_ERROR(MissingBuffer);
		--left;
	}
	dst += code;
	
	while (1) {
		uint8_t curr;
		
		/* save COBS state */
		if (!len--) {
			dst[-code] = code;
			len = 0;
			break;
		}
		
		/* end of code block */
		if (!(curr = *src++)) {
			code = MPT_cobs_zero(code, dst, left, src, len);
		}
		else {
			*(dst++) = curr; --left;
			/* reached maximum length */
			if (++code == MPT_COBS_MAXLEN) {
				/* unable to save continuation state */
				if (!left) {
					--code; --dst;
					dst[-code] = code;
					++len; --src;
					break;
				}
				/* end of code block */
				dst[-code] = code;
				code = 1;
				dst++;
				left--;
			}
		}
		/* save current state */
		if (!left) {
			dst[-code] = code;
			break;
		}
	}
	
	/* update processed data */
	left = cobs->iov_len - left;
	info->_ctx += left - info->done - info->scratch;
	info->done = left - code;
	info->scratch = code;
	
	/* return consumed size */
	return base->iov_len - len;
}